

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch.cc
# Opt level: O3

int __thiscall Patch::copy(Patch *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  vector<Patch::Node*,std::allocator<Patch::Node*>> *this_00;
  EVP_PKEY_CTX EVar1;
  uint32_t uVar2;
  Node **ppNVar3;
  int iVar4;
  undefined4 extraout_var;
  long lVar5;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *extraout_RDX_01;
  EVP_PKEY_CTX *extraout_RDX_02;
  EVP_PKEY_CTX *extraout_RDX_03;
  EVP_PKEY_CTX *extraout_RDX_04;
  EVP_PKEY_CTX *src_00;
  iterator __position;
  Node *new_root;
  Node *local_28;
  
  local_28 = (Node *)0x0;
  if (*(Node **)dst != (Node *)0x0) {
    iVar4 = Node::copy(*(Node **)dst,dst,src);
    local_28 = (Node *)CONCAT44(extraout_var,iVar4);
    ppNVar3 = *(Node ***)(dst + 8);
    __position._M_current = *(Node ***)(dst + 0x10);
    if (*(Node ***)(dst + 0x10) != ppNVar3) {
      *(Node ***)(dst + 0x10) = ppNVar3;
      __position._M_current = ppNVar3;
    }
    this_00 = (vector<Patch::Node*,std::allocator<Patch::Node*>> *)(dst + 8);
    if (__position._M_current == *(Node ***)(dst + 0x18)) {
      std::vector<Patch::Node*,std::allocator<Patch::Node*>>::_M_realloc_insert<Patch::Node*const&>
                (this_00,__position,&local_28);
      lVar5 = *(long *)(dst + 0x10);
      src_00 = extraout_RDX_00;
    }
    else {
      *__position._M_current = local_28;
      lVar5 = *(long *)(dst + 0x10) + 8;
      *(long *)(dst + 0x10) = lVar5;
      src_00 = extraout_RDX;
    }
    if (*(long *)this_00 != lVar5) {
      do {
        ppNVar3 = *(Node ***)(lVar5 + -8);
        *(long *)(dst + 0x10) = lVar5 + -8;
        if (*ppNVar3 != (Node *)0x0) {
          iVar4 = Node::copy(*ppNVar3,(EVP_PKEY_CTX *)__position._M_current,src_00);
          *ppNVar3 = (Node *)CONCAT44(extraout_var_00,iVar4);
          __position._M_current = *(Node ***)(dst + 0x10);
          if (__position._M_current == *(Node ***)(dst + 0x18)) {
            std::vector<Patch::Node*,std::allocator<Patch::Node*>>::
            _M_realloc_insert<Patch::Node*const&>(this_00,__position,ppNVar3);
            src_00 = extraout_RDX_02;
          }
          else {
            *__position._M_current = (Node *)CONCAT44(extraout_var_00,iVar4);
            *(long *)(dst + 0x10) = *(long *)(dst + 0x10) + 8;
            src_00 = extraout_RDX_01;
          }
        }
        if (ppNVar3[1] != (Node *)0x0) {
          iVar4 = Node::copy(ppNVar3[1],(EVP_PKEY_CTX *)__position._M_current,src_00);
          ppNVar3[1] = (Node *)CONCAT44(extraout_var_01,iVar4);
          __position._M_current = *(Node ***)(dst + 0x10);
          if (__position._M_current == *(Node ***)(dst + 0x18)) {
            std::vector<Patch::Node*,std::allocator<Patch::Node*>>::
            _M_realloc_insert<Patch::Node*const&>(this_00,__position,ppNVar3 + 1);
            src_00 = extraout_RDX_04;
          }
          else {
            *__position._M_current = (Node *)CONCAT44(extraout_var_01,iVar4);
            *(long *)(dst + 0x10) = *(long *)(dst + 0x10) + 8;
            src_00 = extraout_RDX_03;
          }
        }
        lVar5 = *(long *)(dst + 0x10);
      } while (*(long *)(dst + 8) != lVar5);
    }
  }
  uVar2 = *(uint32_t *)(dst + 0x38);
  EVar1 = dst[0x3c];
  this->root = local_28;
  (this->node_stack).super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->node_stack).super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->node_stack).super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->left_ancestor_stack).
  super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->left_ancestor_stack).
  super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->left_ancestor_stack).
  super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->change_count = uVar2;
  this->merges_adjacent_changes = (bool)EVar1;
  return (int)this;
}

Assistant:

Patch Patch::copy() {
  Node *new_root = nullptr;
  if (root) {
    new_root = root->copy();
    node_stack.clear();
    node_stack.push_back(new_root);

    while (!node_stack.empty()) {
      Node *node = node_stack.back();
      node_stack.pop_back();
      if (node->left) {
        node->left = node->left->copy();
        node_stack.push_back(node->left);
      }
      if (node->right) {
        node->right = node->right->copy();
        node_stack.push_back(node->right);
      }
    }
  }

  return Patch{new_root, change_count, merges_adjacent_changes};
}